

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O1

int GetLatestHokuyoMessageHokuyo(HOKUYO *pHokuyo,char *databuf,int databuflen,int *pNbdatabytes)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  __time_t _Var12;
  int iVar13;
  long *plVar14;
  uint uVar15;
  long lVar16;
  char cVar17;
  size_t __n;
  char *pcVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  int len;
  char *ptr;
  CHRONO chrono;
  char recvbuf [16384];
  char savebuf [8192];
  int local_60b4;
  timespec local_60b0;
  char *local_60a0;
  int local_6094;
  timespec local_6090;
  undefined8 local_6080;
  undefined8 uStack_6078;
  long local_6070;
  long lStack_6068;
  timespec local_6060;
  int local_6050;
  int *local_6048;
  char *local_6040;
  char local_6038 [8191];
  undefined1 auStack_4039 [8193];
  undefined1 local_2038 [8200];
  
  local_60a0 = (char *)0x0;
  local_60b4 = 0;
  iVar8 = clock_getres(4,&local_6060);
  if ((iVar8 == 0) && (iVar8 = clock_gettime(4,&local_6090), iVar8 == 0)) {
    local_6050 = 0;
    local_6080 = 0;
    uStack_6078 = 0;
    local_6070 = 0;
    lStack_6068 = 0;
  }
  uVar11 = 0;
  memset(local_6038,0,0x4000);
  memset(local_2038,0,0x2000);
  iVar8 = (pHokuyo->RS232Port).DevType;
  cVar17 = '\x01';
  if (iVar8 - 1U < 4) {
    uVar11 = recv((pHokuyo->RS232Port).s,local_6038,0x1fff,0);
    if (-1 < (int)uVar11) {
      cVar17 = ((int)uVar11 == 0) * '\x02';
    }
  }
  else if (iVar8 == 0) {
    uVar11 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038,0x1fff);
    cVar17 = '\x01';
    if (-1 < (int)uVar11) {
      cVar17 = ((int)uVar11 == 0) * '\x02';
    }
  }
  if (cVar17 == '\0') {
    local_6094 = databuflen;
    local_6048 = pNbdatabytes;
    local_6040 = databuf;
    if ((int)uVar11 < 0x1fff) {
      uVar22 = uVar11 & 0xffffffff;
LAB_001c964d:
      iVar8 = FindLatestHokuyoMessage(local_6038,(int)uVar22,&local_60a0,&local_60b4);
      if (iVar8 != 0) {
        do {
          if (local_6050 == 0) {
            clock_gettime(4,&local_60b0);
            local_60b0.tv_sec =
                 (local_60b0.tv_sec + local_6070 + (local_60b0.tv_nsec + lStack_6068) / 1000000000)
                 - local_6090.tv_sec;
            local_60b0.tv_nsec =
                 (local_60b0.tv_nsec + lStack_6068) % 1000000000 - local_6090.tv_nsec;
            if (local_60b0.tv_nsec < 0) {
              local_60b0.tv_sec = local_60b0.tv_sec + local_60b0.tv_nsec / 1000000000 + -1;
              local_60b0.tv_nsec = local_60b0.tv_nsec % 1000000000 + 1000000000;
            }
            plVar14 = &local_60b0.tv_nsec;
            _Var12 = local_60b0.tv_sec;
          }
          else {
            plVar14 = &lStack_6068;
            _Var12 = local_6070;
          }
          if (4.0 < (double)*plVar14 / 1000000000.0 + (double)_Var12) {
LAB_001c986b:
            puts("Error reading data from a Hokuyo : Message timeout. ");
            return 2;
          }
          iVar8 = (int)uVar22;
          if (0x3ffe < iVar8) {
            puts("Error reading data from a Hokuyo : Invalid data. ");
            return 4;
          }
          iVar20 = (pHokuyo->RS232Port).DevType;
          cVar17 = '\x01';
          if (iVar20 - 1U < 4) {
            uVar11 = recv((pHokuyo->RS232Port).s,local_6038 + iVar8,(long)(int)(0x3fffU - iVar8),0);
            if (-1 < (int)uVar11) {
              cVar17 = ((int)uVar11 == 0) * '\x02';
            }
          }
          else if (iVar20 == 0) {
            uVar11 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038 + iVar8,
                          (ulong)(0x3fffU - iVar8));
            cVar17 = ((int)uVar11 == 0) * '\x02';
            if ((int)uVar11 < 0) {
              cVar17 = '\x01';
            }
          }
          if (cVar17 != '\0') goto LAB_001c943a;
          uVar21 = iVar8 + (int)uVar11;
          uVar22 = (ulong)uVar21;
          iVar8 = FindLatestHokuyoMessage(local_6038,uVar21,&local_60a0,&local_60b4);
        } while (iVar8 != 0);
      }
      pcVar18 = local_6040;
      iVar8 = local_6094;
      uVar22 = 0;
      memset(local_6040,0,(long)local_6094);
      uVar11 = 0x1a;
      if (0x1a < (int)(local_60b4 - 1U)) {
        uVar11 = (ulong)(local_60b4 - 1U);
      }
      do {
        if ((local_60a0[uVar22 + 0x19] == '\n') && (local_60a0[uVar22 + 0x1a] == '\n')) {
          iVar20 = (int)uVar22;
          local_60b4 = iVar20 + 0x1b;
          iVar9 = (int)((uVar22 & 0xffffffff) / 0x42) * -0x42;
          iVar13 = iVar9 + iVar20;
          uVar10 = (iVar9 + iVar20) - 2;
          uVar21 = uVar10;
          if (iVar13 < 3) {
            uVar21 = 0;
          }
          iVar20 = uVar21 + ((uint)((ulong)((long)iVar20 * 0x3e0f83e1) >> 0x24) - (iVar20 >> 0x1f))
                            * 0x40;
          *local_6048 = iVar20;
          if (iVar20 <= iVar8) {
            if (iVar20 < 1) {
              return 0;
            }
            if (uVar22 + 0x19 < 0x5b) {
              lVar16 = 0x1a;
              lVar19 = 0;
            }
            else {
              uVar15 = (uint)((uVar22 & 0xffffffff) / 0x42);
              uVar21 = 1;
              if (1 < uVar15) {
                uVar21 = uVar15;
              }
              lVar16 = 0x1a;
              lVar19 = 0;
              do {
                uVar1 = *(undefined8 *)(local_60a0 + lVar16);
                uVar2 = *(undefined8 *)(local_60a0 + lVar16 + 8);
                uVar3 = *(undefined8 *)(local_60a0 + lVar16 + 0x10);
                uVar4 = *(undefined8 *)(local_60a0 + lVar16 + 0x10 + 8);
                uVar5 = *(undefined8 *)(local_60a0 + lVar16 + 0x20);
                uVar6 = *(undefined8 *)(local_60a0 + lVar16 + 0x20 + 8);
                uVar7 = *(undefined8 *)(local_60a0 + lVar16 + 0x30 + 8);
                *(undefined8 *)(pcVar18 + lVar19 + 0x30) =
                     *(undefined8 *)(local_60a0 + lVar16 + 0x30);
                *(undefined8 *)(pcVar18 + lVar19 + 0x30 + 8) = uVar7;
                *(undefined8 *)(pcVar18 + lVar19 + 0x20) = uVar5;
                *(undefined8 *)(pcVar18 + lVar19 + 0x20 + 8) = uVar6;
                *(undefined8 *)(pcVar18 + lVar19 + 0x10) = uVar3;
                *(undefined8 *)(pcVar18 + lVar19 + 0x10 + 8) = uVar4;
                *(undefined8 *)(pcVar18 + lVar19) = uVar1;
                *(undefined8 *)(pcVar18 + lVar19 + 8) = uVar2;
                lVar19 = lVar19 + 0x40;
                lVar16 = lVar16 + 0x42;
              } while (uVar21 << 6 != (int)lVar19);
            }
            if (iVar13 < 3) {
              return 0;
            }
            memcpy(pcVar18 + lVar19,local_60a0 + lVar16,(ulong)uVar10);
            return 0;
          }
          pcVar18 = "Too small data buffer.";
          goto LAB_001c9441;
        }
        uVar22 = uVar22 + 1;
      } while (uVar11 - 0x19 != uVar22);
    }
    else {
      do {
        iVar8 = (int)uVar11;
        if (iVar8 != 0x1fff) {
          __n = (size_t)iVar8;
          memmove(auStack_4039 + -__n,local_6038,__n);
          uVar22 = 0x1fff;
          memcpy(local_6038,local_2038 + __n,(long)(0x1fff - iVar8));
          goto LAB_001c964d;
        }
        lVar16 = local_6070;
        plVar14 = &lStack_6068;
        if (local_6050 == 0) {
          clock_gettime(4,&local_60b0);
          local_60b0.tv_sec =
               (local_60b0.tv_sec + local_6070 + (local_60b0.tv_nsec + lStack_6068) / 1000000000) -
               local_6090.tv_sec;
          local_60b0.tv_nsec = (local_60b0.tv_nsec + lStack_6068) % 1000000000 - local_6090.tv_nsec;
          if (local_60b0.tv_nsec < 0) {
            local_60b0.tv_sec = local_60b0.tv_sec + local_60b0.tv_nsec / 1000000000 + -1;
            local_60b0.tv_nsec = local_60b0.tv_nsec % 1000000000 + 1000000000;
          }
          lVar16 = local_60b0.tv_sec;
          plVar14 = &local_60b0.tv_nsec;
        }
        if (4.0 < (double)*plVar14 / 1000000000.0 + (double)lVar16) goto LAB_001c986b;
        memcpy(local_2038,local_6038,uVar11 & 0xffffffff);
        iVar8 = (pHokuyo->RS232Port).DevType;
        cVar17 = '\x01';
        if (iVar8 - 1U < 4) {
          uVar11 = recv((pHokuyo->RS232Port).s,local_6038,0x1fff,0);
          if (-1 < (int)uVar11) {
            cVar17 = ((int)uVar11 == 0) * '\x02';
          }
        }
        else if (iVar8 == 0) {
          uVar11 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038,0x1fff);
          cVar17 = ((int)uVar11 == 0) * '\x02';
          if ((int)uVar11 < 0) {
            cVar17 = '\x01';
          }
        }
      } while (cVar17 == '\0');
    }
  }
LAB_001c943a:
  pcVar18 = "Error reading data from a Hokuyo. ";
LAB_001c9441:
  puts(pcVar18);
  return 1;
}

Assistant:

inline int GetLatestHokuyoMessageHokuyo(HOKUYO* pHokuyo, char* databuf, int databuflen, int* pNbdatabytes)
{
	char recvbuf[2*MAX_NB_BYTES_HOKUYO];
	char savebuf[MAX_NB_BYTES_HOKUYO];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	int len = 0;
	int i = 0, j = 0, k = 0, nbFullDataBlocks = 0, PartialDataBlockLen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_HOKUYO-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Hokuyo. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
			{
				printf("Error reading data from a Hokuyo : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a Hokuyo. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestHokuyoMessage(recvbuf, BytesReceived, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
		{
			printf("Error reading data from a Hokuyo : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_HOKUYO-1)
		{
			printf("Error reading data from a Hokuyo : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_HOKUYO-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.
	memset(databuf, 0, databuflen);
		
	// MD response...
	// "MD%04d%04d%02d%01d%02d\n99b\n%04d%01d\n  %01d\n    %01d\n\n" ..., &RemainingScans, &TimeStamp, &sum

	i = 25;
	for (;;)
	{
		if ((ptr[i] == '\n')&&(ptr[i+1] == '\n')) break;
		i++;
		if (i >= len-1) 
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
	}

	len = i+2;

	nbFullDataBlocks = (len-27)/66;
	PartialDataBlockLen = (len-27)%66-2;

	// If PartialDataBlockLen <= 0, no partial block, only full of 64 bytes.
	*pNbdatabytes = (PartialDataBlockLen <= 0)? 64*nbFullDataBlocks: 64*nbFullDataBlocks+PartialDataBlockLen;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		j = 0;
		i = 26;
		for (k = 0; k < nbFullDataBlocks; k++)
		{
			memcpy(databuf+j, ptr+i, 64);
			j += 64;
			i += 66;
		}
		if (PartialDataBlockLen > 0) memcpy(databuf+j, ptr+i, PartialDataBlockLen);
	}

	return EXIT_SUCCESS;
}